

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawPolyLines(Vector2 center,int sides,float radius,float rotation,Color color)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  
  iVar1 = 3;
  if (3 < sides) {
    iVar1 = sides;
  }
  fVar5 = (float)iVar1;
  local_58 = rotation * 0.017453292;
  rlBegin(1);
  uStack_44 = center.y;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    rlColor4ub(color.r,color.g,color.b,color.a);
    fVar3 = cosf(local_58);
    local_48 = center.x;
    fVar4 = sinf(local_58);
    rlVertex2f(fVar3 * radius + local_48,fVar4 * radius + uStack_44);
    local_58 = local_58 + (360.0 / fVar5) * 0.017453292;
    fVar3 = cosf(local_58);
    fVar4 = sinf(local_58);
    rlVertex2f(fVar3 * radius + local_48,fVar4 * radius + uStack_44);
  }
  rlEnd();
  return;
}

Assistant:

void DrawPolyLines(Vector2 center, int sides, float radius, float rotation, Color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = rotation*DEG2RAD;
    float angleStep = 360.0f/(float)sides*DEG2RAD;

    rlBegin(RL_LINES);
        for (int i = 0; i < sides; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x + cosf(centralAngle)*radius, center.y + sinf(centralAngle)*radius);
            rlVertex2f(center.x + cosf(centralAngle + angleStep)*radius, center.y + sinf(centralAngle + angleStep)*radius);

            centralAngle += angleStep;
        }
    rlEnd();
}